

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures::~IfcSurfaceStyleWithTextures
          (IfcSurfaceStyleWithTextures *this)

{
  void *pvVar1;
  
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures,_1UL>).
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcSurfaceStyleWithTextures_00887290;
  *(undefined ***)&this->field_0x28 = &PTR__IfcSurfaceStyleWithTextures_008872b8;
  pvVar1 = *(void **)&(this->
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures,_1UL>)
                      .field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures,_1UL>
                                     ).field_0x20 - (long)pvVar1);
    return;
  }
  return;
}

Assistant:

IfcSurfaceStyleWithTextures() : Object("IfcSurfaceStyleWithTextures") {}